

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O3

void __thiscall
std::_Tuple_impl<6UL,_testing::Matcher<int>,_testing::Matcher<int>_>::_Tuple_impl
          (_Tuple_impl<6UL,_testing::Matcher<int>,_testing::Matcher<int>_> *this,
          _Tuple_impl<6UL,_testing::Matcher<int>,_testing::Matcher<int>_> *param_2)

{
  VTable *pVVar1;
  SharedPayloadBase *pSVar2;
  
  (this->super__Tuple_impl<7UL,_testing::Matcher<int>_>).
  super__Head_base<7UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001903e8;
  pVVar1 = (param_2->super__Tuple_impl<7UL,_testing::Matcher<int>_>).
           super__Head_base<7UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
           vtable_;
  (this->super__Tuple_impl<7UL,_testing::Matcher<int>_>).
  super__Head_base<7UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.vtable_ =
       pVVar1;
  pSVar2 = (param_2->super__Tuple_impl<7UL,_testing::Matcher<int>_>).
           super__Head_base<7UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
           buffer_.shared;
  (this->super__Tuple_impl<7UL,_testing::Matcher<int>_>).
  super__Head_base<7UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.buffer_.
  shared = pSVar2;
  if ((pVVar1 != (VTable *)0x0) &&
     (pVVar1->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
    LOCK();
    (pSVar2->ref).super___atomic_base<int>._M_i = (pSVar2->ref).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  (this->super__Tuple_impl<7UL,_testing::Matcher<int>_>).
  super__Head_base<7UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00190378;
  (this->super__Head_base<6UL,_testing::Matcher<int>,_false>)._M_head_impl.super_MatcherBase<int>.
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001903e8;
  pVVar1 = (param_2->super__Head_base<6UL,_testing::Matcher<int>,_false>)._M_head_impl.
           super_MatcherBase<int>.vtable_;
  (this->super__Head_base<6UL,_testing::Matcher<int>,_false>)._M_head_impl.super_MatcherBase<int>.
  vtable_ = pVVar1;
  pSVar2 = (param_2->super__Head_base<6UL,_testing::Matcher<int>,_false>)._M_head_impl.
           super_MatcherBase<int>.buffer_.shared;
  (this->super__Head_base<6UL,_testing::Matcher<int>,_false>)._M_head_impl.super_MatcherBase<int>.
  buffer_.shared = pSVar2;
  if ((pVVar1 != (VTable *)0x0) &&
     (pVVar1->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
    LOCK();
    (pSVar2->ref).super___atomic_base<int>._M_i = (pSVar2->ref).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  (this->super__Head_base<6UL,_testing::Matcher<int>,_false>)._M_head_impl.super_MatcherBase<int>.
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00190378;
  return;
}

Assistant:

MatcherBase(const MatcherBase& other)
      : vtable_(other.vtable_), buffer_(other.buffer_) {
    if (IsShared()) buffer_.shared->Ref();
  }